

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::InitializeConnectionResponse::InitializeConnectionResponse
          (InitializeConnectionResponse *this,InitializeConnectionResponse *param_1)

{
  bool bVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__InitializeConnectionResponse_004098d0;
  bVar1 = param_1->direct_smb_patching_supported_;
  this->using_shmem_provided_by_producer_ = param_1->using_shmem_provided_by_producer_;
  this->direct_smb_patching_supported_ = bVar1;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

InitializeConnectionResponse::InitializeConnectionResponse(InitializeConnectionResponse&&) noexcept = default;